

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIndexSets.cpp
# Opt level: O1

void __thiscall
TasGrid::MultiIndexSet::removeIndex(MultiIndexSet *this,vector<int,_std::allocator<int>_> *p)

{
  pointer __src;
  size_t sVar1;
  pointer piVar2;
  uint uVar3;
  size_t __n;
  pointer piVar4;
  
  uVar3 = getSlot(this,(p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start);
  if (-1 < (int)uVar3) {
    sVar1 = this->num_dimensions;
    if (sVar1 != 0) {
      piVar4 = (this->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar3 * sVar1;
      __src = piVar4 + sVar1;
      __n = (long)(this->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(piVar4,__src,__n);
      }
      piVar2 = (this->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar4 = (pointer)((long)piVar4 + ((long)piVar2 - (long)__src));
      if (piVar2 != piVar4) {
        (this->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar4;
      }
    }
    this->cache_num_indexes = this->cache_num_indexes + -1;
  }
  return;
}

Assistant:

void MultiIndexSet::removeIndex(const std::vector<int> &p){
    int slot = getSlot(p);
    if (slot > -1){
        indexes.erase(indexes.begin() + static_cast<size_t>(slot) * num_dimensions, indexes.begin() + static_cast<size_t>(slot) * num_dimensions + num_dimensions);
        cache_num_indexes--;
    }
}